

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O0

void bloaty::macho::
     ParseMachOHeaderImpl<mach_header_64,bloaty::macho::AddMachOFallback(bloaty::RangeSink*)::__0>
               (string_view macho_data,RangeSink *overhead_sink,
               anon_class_8_1_89918b91 *loadcmd_func)

{
  uint uVar1;
  string_view data_00;
  string_view data_01;
  string_view data_02;
  mach_header_64 *pmVar2;
  load_command *plVar3;
  size_t in_RDX;
  char *in_RSI;
  RangeSink *in_RDI;
  string_view sVar4;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  LoadCommand data;
  load_command *command;
  uint32_t i;
  uint32_t ncmds;
  mach_header_64 *header;
  string_view header_data;
  RangeSink *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  LoadCommand *in_stack_ffffffffffffff40;
  anon_class_8_1_89918b91 *in_stack_ffffffffffffff48;
  RangeSink *in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  LoadCommand *cmd;
  anon_class_8_1_89918b91 *local_98;
  uint local_50;
  RangeSink *local_30;
  char *local_28;
  
  pmVar2 = GetStructPointerAndAdvance<mach_header_64>((string_view *)in_stack_ffffffffffffff50);
  std::basic_string_view<char,_std::char_traits<char>_>::substr
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff50,
             (size_type)in_stack_ffffffffffffff48,(size_type)in_stack_ffffffffffffff40);
  sVar4._M_str = in_stack_ffffffffffffff60;
  sVar4._M_len = in_stack_ffffffffffffff58;
  MaybeAddOverhead(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,sVar4);
  uVar1 = pmVar2->ncmds;
  local_50 = 0;
  local_30 = in_RDI;
  local_28 = in_RSI;
  while( true ) {
    if (uVar1 <= local_50) {
      return;
    }
    data_00._M_str = (char *)in_stack_ffffffffffffff30;
    data_00._M_len = in_RDX;
    plVar3 = GetStructPointer<load_command>(data_00);
    if (plVar3->cmdsize == 0) break;
    LoadCommand::LoadCommand((LoadCommand *)in_stack_ffffffffffffff30);
    Is64Bit<mach_header_64>();
    data_01._M_str = (char *)local_30;
    data_01._M_len = (size_t)in_stack_ffffffffffffff48;
    sVar4 = StrictSubstr(data_01,(size_t)in_stack_ffffffffffffff40,
                         CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    cmd = (LoadCommand *)sVar4._M_len;
    local_98 = (anon_class_8_1_89918b91 *)sVar4._M_str;
    in_stack_ffffffffffffff40 = cmd;
    in_stack_ffffffffffffff48 = local_98;
    AddMachOFallback::anon_class_8_1_89918b91::operator()(local_98,cmd);
    data_02._M_str = &cmd->is64bit;
    data_02._M_len = (size_t)local_28;
    MaybeAddOverhead(local_30,(char *)in_stack_ffffffffffffff48,data_02);
    bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_30,
                       (size_type)in_stack_ffffffffffffff48,(size_type)in_stack_ffffffffffffff40);
    in_stack_ffffffffffffff30 = (RangeSink *)bVar5._M_len;
    in_stack_ffffffffffffff38 = bVar5._M_str._0_4_;
    in_stack_ffffffffffffff3c = bVar5._M_str._4_4_;
    local_28 = bVar5._M_str;
    local_50 = local_50 + 1;
    local_30 = in_stack_ffffffffffffff30;
  }
  Throw(&in_stack_ffffffffffffff40->is64bit,in_stack_ffffffffffffff3c);
}

Assistant:

void ParseMachOHeaderImpl(string_view macho_data, RangeSink* overhead_sink,
                          Func&& loadcmd_func) {
  string_view header_data = macho_data;
  auto header = GetStructPointerAndAdvance<Struct>(&header_data);
  MaybeAddOverhead(overhead_sink,
                   "[Mach-O Headers]",
                   macho_data.substr(0, sizeof(Struct)));
  uint32_t ncmds = header->ncmds;

  for (uint32_t i = 0; i < ncmds; i++) {
    auto command = GetStructPointer<load_command>(header_data);

    // We test for this because otherwise a large ncmds can make bloaty hang for
    // a while, even on a small file.  Hopefully there are no real cases where a
    // zero-size loadcmd exists.
    if (command->cmdsize == 0) {
      THROW("Mach-O load command had zero size.");
    }

    LoadCommand data;
    data.is64bit = Is64Bit<Struct>();
    data.cmd = command->cmd;
    data.command_data = StrictSubstr(header_data, 0, command->cmdsize);
    data.file_data = macho_data;
    std::forward<Func>(loadcmd_func)(data);

    MaybeAddOverhead(overhead_sink, "[Mach-O Headers]", data.command_data);
    header_data = header_data.substr(command->cmdsize);
  }
}